

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewParseTest.cpp
# Opt level: O3

void __thiscall TApp_DefaultComplex_Test::TestBody(TApp_DefaultComplex_Test *this)

{
  App *app;
  bool bVar1;
  long lVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  string help;
  AssertHelper local_1b8 [2];
  undefined1 local_1a8 [16];
  AssertHelper local_198;
  _Alloc_hider local_190;
  undefined1 local_188 [32];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  cx local_108;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_108._M_value._0_4_ = 0;
  local_108._M_value._4_4_ = 0x3ff00000;
  local_108._M_value._8_4_ = 0;
  local_108._M_value._12_4_ = 0x40000000;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-c,--complex","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  app = &(this->super_TApp).app;
  add_option(app,&local_50,&local_108,&local_70,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_168.ptr_ = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"-c","");
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"4","");
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"3","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&local_168,&local_108);
  lVar2 = 0;
  do {
    if (local_118 + lVar2 != *(undefined1 **)((long)local_128 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_128 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x60);
  pcVar3 = "";
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"","");
  CLI::App::help(&local_90,app,0x1e,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_198.data_ = (AssertHelperData *)local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"1","");
  local_168.ptr_ = local_158;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,local_198.data_,(long)&(local_198.data_)->type + local_190._M_p);
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_168.ptr_,local_168.ptr_ + (long)local_160.ptr_);
  if (local_168.ptr_ != local_158) {
    operator_delete(local_168.ptr_);
  }
  local_168.ptr_ = local_158;
  std::__cxx11::string::_M_construct<char*>((string *)&local_168,local_d0,local_d0 + local_c8);
  local_1b8[0].data_ = (AssertHelperData *)local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b8,local_168.ptr_,local_168.ptr_ + (long)local_160.ptr_);
  if (local_168.ptr_ != local_158) {
    operator_delete(local_168.ptr_);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_188 + 0x10,(char *)local_1b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13c382);
  if (local_1b8[0].data_ != (AssertHelperData *)local_1a8) {
    operator_delete(local_1b8[0].data_);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_198.data_ != (AssertHelperData *)local_188) {
    operator_delete(local_198.data_);
  }
  if (local_188[0x10] == '\0') {
    testing::Message::Message((Message *)&local_168);
    if ((undefined8 *)local_188._24_8_ != (undefined8 *)0x0) {
      pcVar3 = *(char **)local_188._24_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp"
               ,0x30,pcVar3);
    testing::internal::AssertHelper::operator=(local_1b8,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(local_1b8);
    if (local_168.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_168.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_168.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_188 + 0x18),
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_198.data_ = (AssertHelperData *)local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"2","");
  local_168.ptr_ = local_158;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,local_198.data_,(long)&(local_198.data_)->type + local_190._M_p);
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_168.ptr_,local_168.ptr_ + (long)local_160.ptr_);
  if (local_168.ptr_ != local_158) {
    operator_delete(local_168.ptr_);
  }
  local_168.ptr_ = local_158;
  std::__cxx11::string::_M_construct<char*>((string *)&local_168,local_f0,local_f0 + local_e8);
  local_1b8[0].data_ = (AssertHelperData *)local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b8,local_168.ptr_,local_168.ptr_ + (long)local_160.ptr_);
  if (local_168.ptr_ != local_158) {
    operator_delete(local_168.ptr_);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_188 + 0x10,(char *)local_1b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13c382);
  if (local_1b8[0].data_ != (AssertHelperData *)local_1a8) {
    operator_delete(local_1b8[0].data_);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_198.data_ != (AssertHelperData *)local_188) {
    operator_delete(local_198.data_);
  }
  if (local_188[0x10] == '\0') {
    testing::Message::Message((Message *)&local_168);
    if ((undefined8 *)local_188._24_8_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_188._24_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp"
               ,0x31,pcVar3);
    testing::internal::AssertHelper::operator=(local_1b8,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(local_1b8);
    if (local_168.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_168.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_168.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_188 + 0x18),
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_198.data_._0_4_ = 1;
  local_1b8[0].data_ =
       (AssertHelperData *)CONCAT44(local_108._M_value._4_4_,local_108._M_value._0_4_);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_168,"1","comp.real()",(int *)&local_198,(double *)local_1b8);
  if (local_168.ptr_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_1b8);
    if (local_160.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_160.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp"
               ,0x33,pcVar3);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_1b8[0].data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1b8[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1b8[0].data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_198.data_._0_4_ = 2;
  local_1b8[0].data_ =
       (AssertHelperData *)CONCAT44(local_108._M_value._12_4_,local_108._M_value._8_4_);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_168,"2","comp.imag()",(int *)&local_198,(double *)local_1b8);
  if (local_168.ptr_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_1b8);
    if (local_160.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_160.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_1b8[0].data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1b8[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1b8[0].data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  TApp::run(&this->super_TApp);
  local_198.data_._0_4_ = 4;
  local_1b8[0].data_ =
       (AssertHelperData *)CONCAT44(local_108._M_value._4_4_,local_108._M_value._0_4_);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_168,"4","comp.real()",(int *)&local_198,(double *)local_1b8);
  if (local_168.ptr_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_1b8);
    if (local_160.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_160.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp"
               ,0x38,pcVar3);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_1b8[0].data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1b8[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1b8[0].data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_198.data_._0_4_ = 3;
  local_1b8[0].data_ =
       (AssertHelperData *)CONCAT44(local_108._M_value._12_4_,local_108._M_value._8_4_);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_168,"3","comp.imag()",(int *)&local_198,(double *)local_1b8);
  if (local_168.ptr_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_1b8);
    if (local_160.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_160.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp"
               ,0x39,pcVar3);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_1b8[0].data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1b8[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1b8[0].data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(TApp, DefaultComplex) {

    cx comp{1, 2};
    add_option(app, "-c,--complex", comp, "", true);
    args = {"-c", "4", "3"};

    std::string help = app.help();
    EXPECT_THAT(help, HasSubstr("1"));
    EXPECT_THAT(help, HasSubstr("2"));

    EXPECT_EQ(1, comp.real());
    EXPECT_EQ(2, comp.imag());

    run();

    EXPECT_EQ(4, comp.real());
    EXPECT_EQ(3, comp.imag());
}